

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int read_exttime(char *p,rar *rar,char *endp)

{
  uint16_t uVar1;
  undefined1 local_98 [8];
  tm tmbuf;
  long nsec;
  time_t t;
  tm *tm;
  uint32_t local_40;
  int i;
  int ttime;
  uint count;
  uint j;
  uint rem;
  uint flags;
  uint rmode;
  char *endp_local;
  rar *rar_local;
  char *p_local;
  
  if (endp < p + 2) {
    p_local._4_4_ = -1;
  }
  else {
    _flags = endp;
    endp_local = (char *)rar;
    rar_local = (rar *)p;
    uVar1 = archive_le16dec(p);
    j = (uint)uVar1;
    rar_local = (rar *)((long)&rar_local->main_flags + 2);
    for (tm._4_4_ = 3; -1 < tm._4_4_; tm._4_4_ = tm._4_4_ + -1) {
      nsec = 0;
      if (tm._4_4_ == 3) {
        nsec = *(long *)(endp_local + 0x30);
      }
      rem = j >> ((byte)(tm._4_4_ << 2) & 0x1f);
      if ((rem & 8) != 0) {
        if (nsec == 0) {
          if (_flags < &rar_local->field_0x4) {
            return -1;
          }
          local_40 = archive_le32dec(rar_local);
          nsec = get_time(local_40);
          rar_local = (rar *)&rar_local->field_0x4;
        }
        count = 0;
        i = rem & 3;
        if (_flags < rar_local->reserved1 + ((ulong)(uint)i - 0x10)) {
          return -1;
        }
        for (ttime = 0; (uint)ttime < (uint)i; ttime = ttime + 1) {
          count = (uint)(byte)rar_local->main_flags << 0x10 | count >> 8;
          rar_local = (rar *)((long)&rar_local->main_flags + 1);
        }
        t = (time_t)localtime_r(&nsec,(tm *)local_98);
        tmbuf.tm_zone = (char *)(ulong)(((tm *)t)->tm_sec + count / 10000000);
        if ((rem & 4) != 0) {
          ((tm *)t)->tm_sec = ((tm *)t)->tm_sec + 1;
          nsec = mktime((tm *)t);
        }
        if (tm._4_4_ == 3) {
          *(long *)(endp_local + 0x30) = nsec;
          *(char **)(endp_local + 0x38) = tmbuf.tm_zone;
        }
        else if (tm._4_4_ == 2) {
          *(long *)(endp_local + 0x80) = nsec;
          *(char **)(endp_local + 0x88) = tmbuf.tm_zone;
        }
        else if (tm._4_4_ == 1) {
          *(long *)(endp_local + 0x70) = nsec;
          *(char **)(endp_local + 0x78) = tmbuf.tm_zone;
        }
        else {
          *(long *)(endp_local + 0x90) = nsec;
          *(char **)(endp_local + 0x98) = tmbuf.tm_zone;
        }
      }
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int
read_exttime(const char *p, struct rar *rar, const char *endp)
{
  unsigned rmode, flags, rem, j, count;
  int ttime, i;
  struct tm *tm;
  time_t t;
  long nsec;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE__LOCALTIME64_S)
  struct tm tmbuf;
#endif
#if defined(HAVE__LOCALTIME64_S)
  errno_t terr;
  __time64_t tmptime;
#endif

  if (p + 2 > endp)
    return (-1);
  flags = archive_le16dec(p);
  p += 2;

  for (i = 3; i >= 0; i--)
  {
    t = 0;
    if (i == 3)
      t = rar->mtime;
    rmode = flags >> i * 4;
    if (rmode & 8)
    {
      if (!t)
      {
        if (p + 4 > endp)
          return (-1);
        ttime = archive_le32dec(p);
        t = get_time(ttime);
        p += 4;
      }
      rem = 0;
      count = rmode & 3;
      if (p + count > endp)
        return (-1);
      for (j = 0; j < count; j++)
      {
        rem = (((unsigned)(unsigned char)*p) << 16) | (rem >> 8);
        p++;
      }
#if defined(HAVE_LOCALTIME_R)
      tm = localtime_r(&t, &tmbuf);
#elif defined(HAVE__LOCALTIME64_S)
      tmptime = t;
      terr = _localtime64_s(&tmbuf, &tmptime);
      if (terr)
        tm = NULL;
      else
        tm = &tmbuf;
#else
      tm = localtime(&t);
#endif
      nsec = tm->tm_sec + rem / NS_UNIT;
      if (rmode & 4)
      {
        tm->tm_sec++;
        t = mktime(tm);
      }
      if (i == 3)
      {
        rar->mtime = t;
        rar->mnsec = nsec;
      }
      else if (i == 2)
      {
        rar->ctime = t;
        rar->cnsec = nsec;
      }
      else if (i == 1)
      {
        rar->atime = t;
        rar->ansec = nsec;
      }
      else
      {
        rar->arctime = t;
        rar->arcnsec = nsec;
      }
    }
  }
  return (0);
}